

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline.hpp
# Opt level: O3

void __thiscall
optimization::inlineFunc::Inline_Func::Inline_Func(Inline_Func *this,bool recursively)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_MirOptimizePass)._vptr_MirOptimizePass =
       (_func_int **)&PTR_pass_name_abi_cxx11__001eb3d0;
  p_Var1 = &(this->uninlineable_funcs)._M_t._M_impl.super__Rb_tree_header;
  (this->uninlineable_funcs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->uninlineable_funcs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->uninlineable_funcs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->uninlineable_funcs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->uninlineable_funcs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->uninlined_funcs)._M_t._M_impl.super__Rb_tree_header;
  (this->uninlined_funcs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->uninlined_funcs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->uninlined_funcs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->uninlined_funcs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->uninlined_funcs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->name,"InlineFunction","");
  this->recursively = recursively;
  return;
}

Assistant:

Inline_Func(bool recursively = true) : recursively(recursively) {}